

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O1

FILE * tplt_open(lemon *lemp)

{
  char *__s;
  bool bVar1;
  int iVar2;
  FILE *pFVar3;
  char *pcVar4;
  char *__filename;
  char buf [1000];
  char acStack_408 [1000];
  
  __filename = acStack_408;
  if (user_templatename != (char *)0x0) {
    iVar2 = access(user_templatename,4);
    if (iVar2 == -1) {
      tplt_open_cold_2();
      return (FILE *)0x0;
    }
    pFVar3 = fopen(user_templatename,"rb");
    if (pFVar3 == (FILE *)0x0) {
      tplt_open_cold_1();
      return (FILE *)0x0;
    }
    return (FILE *)pFVar3;
  }
  __s = lemp->filename;
  pcVar4 = strrchr(__s,0x2e);
  if (pcVar4 == (char *)0x0) {
    sprintf(acStack_408,"%s.lt",__s);
  }
  else {
    sprintf(acStack_408,"%.*s.lt",(ulong)(uint)((int)pcVar4 - (int)__s),__s);
  }
  iVar2 = access(acStack_408,4);
  if (iVar2 != 0) {
    __filename = tplt_open::templatename;
    iVar2 = access(tplt_open::templatename,4);
    if (iVar2 != 0) {
      __filename = pathsearch(lemp->argv0,tplt_open::templatename,0);
      bVar1 = true;
      goto LAB_0010aa84;
    }
  }
  bVar1 = false;
LAB_0010aa84:
  if (__filename == (char *)0x0) {
    tplt_open_cold_4();
  }
  else {
    pFVar3 = fopen(__filename,"rb");
    if (pFVar3 != (FILE *)0x0) {
      if (bVar1) {
        free(__filename);
        return (FILE *)pFVar3;
      }
      return (FILE *)pFVar3;
    }
    tplt_open_cold_3();
  }
  return (FILE *)0x0;
}

Assistant:

PRIVATE FILE *tplt_open(struct lemon *lemp)
{
  static char templatename[] = "lempar.c";
  char buf[1000];
  FILE *in;
  char *tpltname;
  char *cp;
  Boolean tpltnameinbuf;

  /* first, see if user specified a template filename on the command line. */
  if (user_templatename != 0) {
    if( access(user_templatename,004)==-1 ){
      fprintf(stderr,"Can't find the parser driver template file \"%s\".\n",
        user_templatename);
      lemp->errorcnt++;
      return 0;
    }
    in = fopen(user_templatename,"rb");
    if( in==0 ){
      fprintf(stderr,"Can't open the template file \"%s\".\n",
              user_templatename);
      lemp->errorcnt++;
      return 0;
    }
    return in;
  }

  cp = strrchr(lemp->filename,'.');
  if( cp ){
    sprintf(buf,"%.*s.lt",(int)(cp-lemp->filename),lemp->filename);
  }else{
    sprintf(buf,"%s.lt",lemp->filename);
  }
  if( access(buf,004)==0 ){
    tpltname = buf;
    tpltnameinbuf = LEMON_TRUE;
  }else if( access(templatename,004)==0 ){
    tpltname = templatename;
    tpltnameinbuf = LEMON_TRUE;
  }else{
    tpltname = pathsearch(lemp->argv0,templatename,0);
    tpltnameinbuf = LEMON_FALSE;
  }
  if( tpltname==0 ){
    fprintf(stderr,"Can't find the parser driver template file \"%s\".\n",
    templatename);
    lemp->errorcnt++;
    return 0;
  }
  in = fopen(tpltname,"rb");
  if( in==0 ){
    fprintf(stderr,"Can't open the template file \"%s\".\n",templatename);
    if (tpltnameinbuf == LEMON_FALSE) free(tpltname);
    lemp->errorcnt++;
    return 0;
  }
  if (tpltnameinbuf == LEMON_FALSE) free(tpltname);
  return in;
}